

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-square.c
# Opt level: O1

_Bool square_dtrap_edge(chunk_conflict *c,loc grid)

{
  _Bool _Var1;
  loc lVar2;
  
  _Var1 = square_isdtrap(c,grid);
  if (_Var1) {
    lVar2 = next_grid(grid,L'\x02');
    _Var1 = square_in_bounds_fully(c,lVar2);
    if (_Var1) {
      lVar2 = next_grid(grid,L'\x02');
      _Var1 = square_isdtrap(c,lVar2);
      if (!_Var1) {
        return true;
      }
    }
    lVar2 = next_grid(grid,L'\x06');
    _Var1 = square_in_bounds_fully(c,lVar2);
    if (_Var1) {
      lVar2 = next_grid(grid,L'\x06');
      _Var1 = square_isdtrap(c,lVar2);
      if (!_Var1) {
        return true;
      }
    }
    lVar2 = next_grid(grid,L'\b');
    _Var1 = square_in_bounds_fully(c,lVar2);
    if (_Var1) {
      lVar2 = next_grid(grid,L'\b');
      _Var1 = square_isdtrap(c,lVar2);
      if (!_Var1) {
        return true;
      }
    }
    lVar2 = next_grid(grid,L'\x04');
    _Var1 = square_in_bounds_fully(c,lVar2);
    if (_Var1) {
      lVar2 = next_grid(grid,L'\x04');
      _Var1 = square_isdtrap(c,lVar2);
      if (!_Var1) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool square_dtrap_edge(struct chunk *c, struct loc grid)
{
	/* Check if the square is a dtrap in the first place */
	if (!square_isdtrap(c, grid)) return false;

	/* Check for non-dtrap adjacent grids */
	if (square_in_bounds_fully(c, next_grid(grid, DIR_S)) &&
		(!square_isdtrap(c, next_grid(grid, DIR_S))))
		return true;
	if (square_in_bounds_fully(c, next_grid(grid, DIR_E)) &&
		(!square_isdtrap(c, next_grid(grid, DIR_E))))
		return true;
	if (square_in_bounds_fully(c, next_grid(grid, DIR_N)) &&
		(!square_isdtrap(c, next_grid(grid, DIR_N))))
		return true;
	if (square_in_bounds_fully(c, next_grid(grid, DIR_W)) &&
		(!square_isdtrap(c, next_grid(grid, DIR_W))))
		return true;

	return false;
}